

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitLoop(ParseNodeStmt *loopNode,ParseNode *cond,ParseNode *body,ParseNode *incr,
             ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,BOOL fReturnValue,BOOL doWhile,
             ParseNodeBlock *forLoopBlock)

{
  ByteCodeWriter *this;
  bool bVar1;
  ByteCodeLabel loopEntrance;
  ByteCodeLabel falseLabel;
  uint loopId;
  ByteCodeLabel trueLabel;
  ParseNodeInt *pPVar2;
  FuncInfo *funcInfo_00;
  
  this = &byteCodeGenerator->m_writer;
  loopEntrance = Js::ByteCodeWriter::DefineLabel(this);
  falseLabel = Js::ByteCodeWriter::DefineLabel(this);
  loopId = Js::ByteCodeWriter::EnterLoop(this,loopEntrance);
  ByteCodeGenerator::PushJumpCleanupForLoop(byteCodeGenerator,&loopNode->super_ParseNode,loopId);
  if (doWhile == 0) {
    if (cond != (ParseNode *)0x0) {
      if (cond->nop == knopInt) {
        pPVar2 = ParseNode::AsParseNodeInt(cond);
        if (pPVar2->lw == 0) goto LAB_0081385a;
      }
      else {
LAB_0081385a:
        trueLabel = Js::ByteCodeWriter::DefineLabel(this);
        EmitBooleanExpression(cond,trueLabel,falseLabel,byteCodeGenerator,funcInfo,true,false);
        Js::ByteCodeWriter::MarkLabel(this,trueLabel);
      }
      FuncInfo::ReleaseLoc(funcInfo,cond);
    }
    Emit(body,byteCodeGenerator,funcInfo,fReturnValue,false,false);
    FuncInfo::ReleaseLoc(funcInfo,body);
    if (forLoopBlock != (ParseNodeBlock *)0x0) {
      CloneEmitBlock(forLoopBlock,byteCodeGenerator,funcInfo_00);
    }
    if (loopNode->emitLabels == true) {
      Js::ByteCodeWriter::MarkLabel(this,loopNode->continueLabel);
    }
    if (incr != (ParseNode *)0x0) {
      Emit(incr,byteCodeGenerator,funcInfo,0,false,false);
      FuncInfo::ReleaseLoc(funcInfo,incr);
    }
    Js::ByteCodeWriter::Br(this,loopEntrance);
    goto LAB_00813926;
  }
  Emit(body,byteCodeGenerator,funcInfo,fReturnValue,false,false);
  FuncInfo::ReleaseLoc(funcInfo,body);
  if (loopNode->emitLabels == true) {
    Js::ByteCodeWriter::MarkLabel(this,loopNode->continueLabel);
  }
  bVar1 = ByteCodeGenerator::IsFalse(cond);
  if (bVar1) {
    bVar1 = ByteCodeGenerator::IsInDebugMode(byteCodeGenerator);
    if (bVar1) goto LAB_008137fc;
  }
  else {
LAB_008137fc:
    EmitBooleanExpression(cond,loopEntrance,falseLabel,byteCodeGenerator,funcInfo,false,false);
  }
  FuncInfo::ReleaseLoc(funcInfo,cond);
LAB_00813926:
  Js::ByteCodeWriter::MarkLabel(this,falseLabel);
  if (loopNode->emitLabels == true) {
    Js::ByteCodeWriter::MarkLabel(this,loopNode->breakLabel);
  }
  DListBase<JumpCleanupInfo,_RealCount>::RemoveHead<Memory::ArenaAllocator>
            (&byteCodeGenerator->jumpCleanupList->super_DListBase<JumpCleanupInfo,_RealCount>,
             byteCodeGenerator->jumpCleanupList->allocator);
  Js::ByteCodeWriter::ExitLoop(this,loopId);
  return;
}

Assistant:

void EmitLoop(
    ParseNodeStmt *loopNode,
    ParseNode *cond,
    ParseNode *body,
    ParseNode *incr,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    BOOL fReturnValue,
    BOOL doWhile = FALSE,
    ParseNodeBlock *forLoopBlock = nullptr)
{
    // Need to increment loop count whether we are going to profile or not for HasLoop()

    Js::ByteCodeLabel loopEntrance = byteCodeGenerator->Writer()->DefineLabel();
    Js::ByteCodeLabel continuePastLoop = byteCodeGenerator->Writer()->DefineLabel();

    uint loopId = byteCodeGenerator->Writer()->EnterLoop(loopEntrance);
    byteCodeGenerator->PushJumpCleanupForLoop(loopNode, loopId);

    if (doWhile)
    {
        Emit(body, byteCodeGenerator, funcInfo, fReturnValue);
        funcInfo->ReleaseLoc(body);
        if (loopNode->emitLabels)
        {
            byteCodeGenerator->Writer()->MarkLabel(loopNode->continueLabel);
        }
        if (!ByteCodeGenerator::IsFalse(cond) ||
            byteCodeGenerator->IsInDebugMode())
        {
            EmitBooleanExpression(cond, loopEntrance, continuePastLoop, byteCodeGenerator, funcInfo, false, false);
        }
        funcInfo->ReleaseLoc(cond);
    }
    else
    {
        if (cond)
        {
            if (!(cond->nop == knopInt &&
                cond->AsParseNodeInt()->lw != 0))
            {
                Js::ByteCodeLabel trueLabel = byteCodeGenerator->Writer()->DefineLabel();
                EmitBooleanExpression(cond, trueLabel, continuePastLoop, byteCodeGenerator, funcInfo, true, false);
                byteCodeGenerator->Writer()->MarkLabel(trueLabel);
            }
            funcInfo->ReleaseLoc(cond);
        }
        Emit(body, byteCodeGenerator, funcInfo, fReturnValue);
        funcInfo->ReleaseLoc(body);

        if (forLoopBlock != nullptr)
        {
            CloneEmitBlock(forLoopBlock, byteCodeGenerator, funcInfo);
        }

        if (loopNode->emitLabels)
        {
            byteCodeGenerator->Writer()->MarkLabel(loopNode->continueLabel);
        }

        if (incr != nullptr)
        {
            Emit(incr, byteCodeGenerator, funcInfo, false);
            funcInfo->ReleaseLoc(incr);
        }

        byteCodeGenerator->Writer()->Br(loopEntrance);
    }

    byteCodeGenerator->Writer()->MarkLabel(continuePastLoop);
    if (loopNode->emitLabels)
    {
        byteCodeGenerator->Writer()->MarkLabel(loopNode->breakLabel);
    }

    byteCodeGenerator->PopJumpCleanup();
    byteCodeGenerator->Writer()->ExitLoop(loopId);
}